

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O1

void Imf_3_2::anon_unknown_9::dctInverse8x8_scalar<0>(float *data)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  
  lVar3 = 0;
  do {
    fVar19 = *(float *)((long)data + lVar3 + 0x68);
    fVar18 = *(float *)((long)data + lVar3 + 0x48);
    fVar17 = *(float *)((long)data + lVar3 + 0x28);
    fVar28 = *(float *)((long)data + lVar3 + 4);
    fVar29 = *(float *)((long)data + lVar3 + 8);
    fVar30 = *(float *)((long)data + lVar3 + 0xc);
    fVar16 = *(float *)((long)data + lVar3 + 0x78);
    fVar31 = *(float *)((long)data + lVar3 + 0x58);
    fVar32 = *(float *)((long)data + lVar3 + 0x38);
    fVar33 = *(float *)((long)data + lVar3 + 0x18);
    fVar24 = fVar29 * 0.19134216 - fVar33 * 0.46193984;
    fVar25 = fVar17 * 0.19134216 - fVar32 * 0.46193984;
    fVar26 = fVar18 * 0.19134216 - fVar31 * 0.46193984;
    fVar27 = fVar19 * 0.19134216 - fVar16 * 0.46193984;
    fVar4 = fVar33 * 0.19134216 + fVar29 * 0.46193984;
    fVar5 = fVar32 * 0.19134216 + fVar17 * 0.46193984;
    fVar6 = fVar31 * 0.19134216 + fVar18 * 0.46193984;
    fVar7 = fVar16 * 0.19134216 + fVar19 * 0.46193984;
    fVar19 = *(float *)((long)data + lVar3 + 100);
    fVar18 = *(float *)((long)data + lVar3 + 0x44);
    fVar17 = *(float *)((long)data + lVar3 + 0x24);
    fVar29 = *(float *)((long)data + lVar3 + 0x6c);
    fVar16 = *(float *)((long)data + lVar3 + 0x4c);
    fVar31 = *(float *)((long)data + lVar3 + 0x2c);
    fVar32 = *(float *)((long)data + lVar3 + 0x74);
    fVar33 = *(float *)((long)data + lVar3 + 0x54);
    fVar34 = *(float *)((long)data + lVar3 + 0x34);
    fVar35 = *(float *)((long)data + lVar3 + 0x14);
    fVar36 = *(float *)((long)data + lVar3 + 0x7c);
    fVar37 = *(float *)((long)data + lVar3 + 0x5c);
    fVar38 = *(float *)((long)data + lVar3 + 0x3c);
    fVar39 = *(float *)((long)data + lVar3 + 0x1c);
    fVar20 = fVar39 * 0.097545706 + fVar35 * 0.27778545 + fVar28 * 0.49039266 + fVar30 * 0.41573495;
    fVar21 = fVar38 * 0.097545706 + fVar34 * 0.27778545 + fVar17 * 0.49039266 + fVar31 * 0.41573495;
    fVar22 = fVar37 * 0.097545706 + fVar33 * 0.27778545 + fVar18 * 0.49039266 + fVar16 * 0.41573495;
    fVar23 = fVar36 * 0.097545706 + fVar32 * 0.27778545 + fVar19 * 0.49039266 + fVar29 * 0.41573495;
    fVar12 = fVar39 * -0.27778545 +
             fVar35 * -0.49039266 + fVar28 * 0.41573495 + fVar30 * -0.097545706;
    fVar13 = fVar38 * -0.27778545 +
             fVar34 * -0.49039266 + fVar17 * 0.41573495 + fVar31 * -0.097545706;
    fVar14 = fVar37 * -0.27778545 +
             fVar33 * -0.49039266 + fVar18 * 0.41573495 + fVar16 * -0.097545706;
    fVar15 = fVar36 * -0.27778545 +
             fVar32 * -0.49039266 + fVar19 * 0.41573495 + fVar29 * -0.097545706;
    fVar8 = fVar39 * 0.41573495 + fVar35 * 0.097545706 + fVar28 * 0.27778545 + fVar30 * -0.49039266;
    fVar9 = fVar38 * 0.41573495 + fVar34 * 0.097545706 + fVar17 * 0.27778545 + fVar31 * -0.49039266;
    fVar10 = fVar37 * 0.41573495 + fVar33 * 0.097545706 + fVar18 * 0.27778545 + fVar16 * -0.49039266
    ;
    fVar11 = fVar36 * 0.41573495 + fVar32 * 0.097545706 + fVar19 * 0.27778545 + fVar29 * -0.49039266
    ;
    fVar40 = fVar39 * -0.49039266 +
             fVar35 * 0.41573495 + fVar28 * 0.097545706 + fVar30 * -0.27778545;
    fVar41 = fVar38 * -0.49039266 +
             fVar34 * 0.41573495 + fVar17 * 0.097545706 + fVar31 * -0.27778545;
    fVar42 = fVar37 * -0.49039266 +
             fVar33 * 0.41573495 + fVar18 * 0.097545706 + fVar16 * -0.27778545;
    fVar43 = fVar36 * -0.49039266 +
             fVar32 * 0.41573495 + fVar19 * 0.097545706 + fVar29 * -0.27778545;
    fVar19 = *(float *)((long)data + lVar3 + 0x60);
    fVar18 = *(float *)((long)data + lVar3 + 0x40);
    fVar17 = *(float *)((long)data + lVar3 + 0x20);
    fVar28 = *(float *)((long)data + lVar3 + 0x70);
    fVar29 = *(float *)((long)data + lVar3 + 0x50);
    fVar30 = *(float *)((long)data + lVar3 + 0x30);
    fVar16 = *(float *)((long)data + lVar3 + 0x10);
    fVar32 = (*(float *)((long)data + lVar3) + fVar16) * 0.35355362;
    fVar33 = (fVar17 + fVar30) * 0.35355362;
    fVar34 = (fVar18 + fVar29) * 0.35355362;
    fVar35 = (fVar19 + fVar28) * 0.35355362;
    fVar16 = (*(float *)((long)data + lVar3) - fVar16) * 0.35355362;
    fVar17 = (fVar17 - fVar30) * 0.35355362;
    fVar18 = (fVar18 - fVar29) * 0.35355362;
    fVar19 = (fVar19 - fVar28) * 0.35355362;
    fVar28 = fVar4 + fVar32;
    fVar29 = fVar5 + fVar33;
    fVar30 = fVar6 + fVar34;
    fVar31 = fVar7 + fVar35;
    fVar36 = fVar24 + fVar16;
    fVar37 = fVar25 + fVar17;
    fVar38 = fVar26 + fVar18;
    fVar39 = fVar27 + fVar19;
    fVar16 = fVar16 - fVar24;
    fVar17 = fVar17 - fVar25;
    fVar18 = fVar18 - fVar26;
    fVar19 = fVar19 - fVar27;
    fVar32 = fVar32 - fVar4;
    fVar33 = fVar33 - fVar5;
    fVar34 = fVar34 - fVar6;
    fVar35 = fVar35 - fVar7;
    pfVar1 = (float *)((long)data + lVar3 + 0x70);
    *pfVar1 = fVar35 - fVar43;
    pfVar1[1] = fVar19 - fVar11;
    pfVar1[2] = fVar39 - fVar15;
    pfVar1[3] = fVar31 - fVar23;
    pfVar1 = (float *)((long)data + lVar3 + 0x60);
    *pfVar1 = fVar23 + fVar31;
    pfVar1[1] = fVar15 + fVar39;
    pfVar1[2] = fVar11 + fVar19;
    pfVar1[3] = fVar43 + fVar35;
    pfVar1 = (float *)((long)data + lVar3 + 0x50);
    *pfVar1 = fVar34 - fVar42;
    pfVar1[1] = fVar18 - fVar10;
    pfVar1[2] = fVar38 - fVar14;
    pfVar1[3] = fVar30 - fVar22;
    pfVar1 = (float *)((long)data + lVar3 + 0x40);
    *pfVar1 = fVar22 + fVar30;
    pfVar1[1] = fVar14 + fVar38;
    pfVar1[2] = fVar10 + fVar18;
    pfVar1[3] = fVar42 + fVar34;
    pfVar1 = (float *)((long)data + lVar3 + 0x30);
    *pfVar1 = fVar33 - fVar41;
    pfVar1[1] = fVar17 - fVar9;
    pfVar1[2] = fVar37 - fVar13;
    pfVar1[3] = fVar29 - fVar21;
    pfVar1 = (float *)((long)data + lVar3 + 0x20);
    *pfVar1 = fVar21 + fVar29;
    pfVar1[1] = fVar13 + fVar37;
    pfVar1[2] = fVar9 + fVar17;
    pfVar1[3] = fVar41 + fVar33;
    pfVar1 = (float *)((long)data + lVar3 + 0x10);
    *pfVar1 = fVar32 - fVar40;
    pfVar1[1] = fVar16 - fVar8;
    pfVar1[2] = fVar36 - fVar12;
    pfVar1[3] = fVar28 - fVar20;
    pfVar1 = (float *)((long)data + lVar3);
    *pfVar1 = fVar20 + fVar28;
    pfVar1[1] = fVar12 + fVar36;
    pfVar1[2] = fVar8 + fVar16;
    pfVar1[3] = fVar40 + fVar32;
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x100);
  lVar3 = -8;
  do {
    pfVar1 = data + lVar3 + 0x10;
    fVar19 = *pfVar1;
    fVar18 = pfVar1[1];
    fVar17 = pfVar1[2];
    fVar28 = pfVar1[3];
    pfVar1 = data + lVar3 + 0x18;
    pfVar2 = data + lVar3 + 0x20;
    fVar29 = *pfVar2;
    fVar30 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar31 = pfVar2[3];
    pfVar2 = data + lVar3 + 0x38;
    fVar12 = *pfVar1 * 0.19134216 - *pfVar2 * 0.46193984;
    fVar13 = pfVar1[1] * 0.19134216 - pfVar2[1] * 0.46193984;
    fVar14 = pfVar1[2] * 0.19134216 - pfVar2[2] * 0.46193984;
    fVar15 = pfVar1[3] * 0.19134216 - pfVar2[3] * 0.46193984;
    fVar20 = *pfVar2 * 0.19134216 + *pfVar1 * 0.46193984;
    fVar21 = pfVar2[1] * 0.19134216 + pfVar1[1] * 0.46193984;
    fVar22 = pfVar2[2] * 0.19134216 + pfVar1[2] * 0.46193984;
    fVar23 = pfVar2[3] * 0.19134216 + pfVar1[3] * 0.46193984;
    pfVar1 = data + lVar3 + 0x30;
    fVar32 = *pfVar1;
    fVar33 = pfVar1[1];
    fVar34 = pfVar1[2];
    fVar35 = pfVar1[3];
    pfVar1 = data + lVar3 + 0x40;
    fVar36 = *pfVar1;
    fVar37 = pfVar1[1];
    fVar38 = pfVar1[2];
    fVar39 = pfVar1[3];
    fVar8 = fVar36 * 0.097545706 + fVar32 * 0.27778545 + fVar19 * 0.49039266 + fVar29 * 0.41573495;
    fVar9 = fVar37 * 0.097545706 + fVar33 * 0.27778545 + fVar18 * 0.49039266 + fVar30 * 0.41573495;
    fVar10 = fVar38 * 0.097545706 + fVar34 * 0.27778545 + fVar17 * 0.49039266 + fVar16 * 0.41573495;
    fVar11 = fVar39 * 0.097545706 + fVar35 * 0.27778545 + fVar28 * 0.49039266 + fVar31 * 0.41573495;
    fVar24 = fVar36 * -0.27778545 +
             fVar32 * -0.49039266 + fVar19 * 0.41573495 + fVar29 * -0.097545706;
    fVar25 = fVar37 * -0.27778545 +
             fVar33 * -0.49039266 + fVar18 * 0.41573495 + fVar30 * -0.097545706;
    fVar26 = fVar38 * -0.27778545 +
             fVar34 * -0.49039266 + fVar17 * 0.41573495 + fVar16 * -0.097545706;
    fVar27 = fVar39 * -0.27778545 +
             fVar35 * -0.49039266 + fVar28 * 0.41573495 + fVar31 * -0.097545706;
    fVar4 = fVar36 * 0.41573495 + fVar32 * 0.097545706 + fVar19 * 0.27778545 + fVar29 * -0.49039266;
    fVar5 = fVar37 * 0.41573495 + fVar33 * 0.097545706 + fVar18 * 0.27778545 + fVar30 * -0.49039266;
    fVar6 = fVar38 * 0.41573495 + fVar34 * 0.097545706 + fVar17 * 0.27778545 + fVar16 * -0.49039266;
    fVar7 = fVar39 * 0.41573495 + fVar35 * 0.097545706 + fVar28 * 0.27778545 + fVar31 * -0.49039266;
    pfVar1 = data + lVar3 + 8;
    fVar36 = fVar36 * -0.49039266 +
             fVar32 * 0.41573495 + fVar19 * 0.097545706 + fVar29 * -0.27778545;
    fVar37 = fVar37 * -0.49039266 +
             fVar33 * 0.41573495 + fVar18 * 0.097545706 + fVar30 * -0.27778545;
    fVar38 = fVar38 * -0.49039266 +
             fVar34 * 0.41573495 + fVar17 * 0.097545706 + fVar16 * -0.27778545;
    fVar39 = fVar39 * -0.49039266 +
             fVar35 * 0.41573495 + fVar28 * 0.097545706 + fVar31 * -0.27778545;
    pfVar2 = data + lVar3 + 0x28;
    fVar32 = (*pfVar1 + *pfVar2) * 0.35355362;
    fVar33 = (pfVar1[1] + pfVar2[1]) * 0.35355362;
    fVar34 = (pfVar1[2] + pfVar2[2]) * 0.35355362;
    fVar35 = (pfVar1[3] + pfVar2[3]) * 0.35355362;
    fVar19 = (*pfVar1 - *pfVar2) * 0.35355362;
    fVar18 = (pfVar1[1] - pfVar2[1]) * 0.35355362;
    fVar17 = (pfVar1[2] - pfVar2[2]) * 0.35355362;
    fVar28 = (pfVar1[3] - pfVar2[3]) * 0.35355362;
    fVar29 = fVar12 + fVar19;
    fVar30 = fVar13 + fVar18;
    fVar16 = fVar14 + fVar17;
    fVar31 = fVar15 + fVar28;
    fVar19 = fVar19 - fVar12;
    fVar18 = fVar18 - fVar13;
    fVar17 = fVar17 - fVar14;
    fVar28 = fVar28 - fVar15;
    fVar12 = fVar20 + fVar32;
    fVar13 = fVar21 + fVar33;
    fVar14 = fVar22 + fVar34;
    fVar15 = fVar23 + fVar35;
    fVar32 = fVar32 - fVar20;
    fVar33 = fVar33 - fVar21;
    fVar34 = fVar34 - fVar22;
    fVar35 = fVar35 - fVar23;
    pfVar1 = data + lVar3 + 8;
    *pfVar1 = fVar8 + fVar12;
    pfVar1[1] = fVar9 + fVar13;
    pfVar1[2] = fVar10 + fVar14;
    pfVar1[3] = fVar11 + fVar15;
    pfVar1 = data + lVar3 + 0x10;
    *pfVar1 = fVar24 + fVar29;
    pfVar1[1] = fVar25 + fVar30;
    pfVar1[2] = fVar26 + fVar16;
    pfVar1[3] = fVar27 + fVar31;
    pfVar1 = data + lVar3 + 0x18;
    *pfVar1 = fVar4 + fVar19;
    pfVar1[1] = fVar5 + fVar18;
    pfVar1[2] = fVar6 + fVar17;
    pfVar1[3] = fVar7 + fVar28;
    pfVar1 = data + lVar3 + 0x20;
    *pfVar1 = fVar36 + fVar32;
    pfVar1[1] = fVar37 + fVar33;
    pfVar1[2] = fVar38 + fVar34;
    pfVar1[3] = fVar39 + fVar35;
    pfVar1 = data + lVar3 + 0x28;
    *pfVar1 = fVar32 - fVar36;
    pfVar1[1] = fVar33 - fVar37;
    pfVar1[2] = fVar34 - fVar38;
    pfVar1[3] = fVar35 - fVar39;
    pfVar1 = data + lVar3 + 0x30;
    *pfVar1 = fVar19 - fVar4;
    pfVar1[1] = fVar18 - fVar5;
    pfVar1[2] = fVar17 - fVar6;
    pfVar1[3] = fVar28 - fVar7;
    pfVar1 = data + lVar3 + 0x38;
    *pfVar1 = fVar29 - fVar24;
    pfVar1[1] = fVar30 - fVar25;
    pfVar1[2] = fVar16 - fVar26;
    pfVar1[3] = fVar31 - fVar27;
    pfVar1 = data + lVar3 + 0x40;
    *pfVar1 = fVar12 - fVar8;
    pfVar1[1] = fVar13 - fVar9;
    pfVar1[2] = fVar14 - fVar10;
    pfVar1[3] = fVar15 - fVar11;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  return;
}

Assistant:

void
dctInverse8x8_scalar (float* data)
{
    const float a = .5f * cosf (3.14159f / 4.0f);
    const float b = .5f * cosf (3.14159f / 16.0f);
    const float c = .5f * cosf (3.14159f / 8.0f);
    const float d = .5f * cosf (3.f * 3.14159f / 16.0f);
    const float e = .5f * cosf (5.f * 3.14159f / 16.0f);
    const float f = .5f * cosf (3.f * 3.14159f / 8.0f);
    const float g = .5f * cosf (7.f * 3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float* rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2];
        alpha[1] = f * rowPtr[2];
        alpha[2] = c * rowPtr[6];
        alpha[3] = f * rowPtr[6];

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16 + column];
        alpha[1] = f * data[16 + column];
        alpha[2] = c * data[48 + column];
        alpha[3] = f * data[48 + column];

        beta[0] = b * data[8 + column] + d * data[24 + column] +
                  e * data[40 + column] + g * data[56 + column];

        beta[1] = d * data[8 + column] - g * data[24 + column] -
                  b * data[40 + column] - e * data[56 + column];

        beta[2] = e * data[8 + column] - b * data[24 + column] +
                  g * data[40 + column] + d * data[56 + column];

        beta[3] = g * data[8 + column] - e * data[24 + column] +
                  d * data[40 + column] - b * data[56 + column];

        theta[0] = a * (data[column] + data[32 + column]);
        theta[3] = a * (data[column] - data[32 + column]);

        theta[1] = alpha[0] + alpha[3];
        theta[2] = alpha[1] - alpha[2];

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[column]      = gamma[0] + beta[0];
        data[8 + column]  = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}